

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bufq.c
# Opt level: O0

ssize_t Curl_bufq_pass(bufq *q,Curl_bufq_writer *writer,void *writer_ctx,CURLcode *err)

{
  _Bool _Var1;
  size_t amount;
  ssize_t chunk_written;
  ssize_t nwritten;
  size_t blen;
  uchar *buf;
  CURLcode *err_local;
  void *writer_ctx_local;
  Curl_bufq_writer *writer_local;
  bufq *q_local;
  
  chunk_written = 0;
  buf = (uchar *)err;
  err_local = (CURLcode *)writer_ctx;
  writer_ctx_local = writer;
  writer_local = (Curl_bufq_writer *)q;
  while( true ) {
    _Var1 = Curl_bufq_peek((bufq *)writer_local,(uchar **)&blen,(size_t *)&nwritten);
    if (!_Var1) {
      return chunk_written;
    }
    amount = (*(code *)writer_ctx_local)(err_local,blen,nwritten,buf);
    if ((long)amount < 0) break;
    if (amount == 0) {
      if (chunk_written != 0) {
        return chunk_written;
      }
      buf[0] = 'Q';
      buf[1] = '\0';
      buf[2] = '\0';
      buf[3] = '\0';
      return -1;
    }
    Curl_bufq_skip((bufq *)writer_local,amount);
    chunk_written = amount + chunk_written;
  }
  if ((chunk_written != 0) && (*(int *)buf == 0x51)) {
    return chunk_written;
  }
  return -1;
}

Assistant:

ssize_t Curl_bufq_pass(struct bufq *q, Curl_bufq_writer *writer,
                       void *writer_ctx, CURLcode *err)
{
  const unsigned char *buf;
  size_t blen;
  ssize_t nwritten = 0;

  while(Curl_bufq_peek(q, &buf, &blen)) {
    ssize_t chunk_written;

    chunk_written = writer(writer_ctx, buf, blen, err);
    if(chunk_written < 0) {
      if(!nwritten || *err != CURLE_AGAIN) {
        /* blocked on first write or real error, fail */
        nwritten = -1;
      }
      break;
    }
    if(!chunk_written) {
      if(!nwritten) {
        /* treat as blocked */
        *err = CURLE_AGAIN;
        nwritten = -1;
      }
      break;
    }
    Curl_bufq_skip(q, (size_t)chunk_written);
    nwritten += chunk_written;
  }
  return nwritten;
}